

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_mark.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::mark_class_closures
          (Omega_h *this,Mesh *mesh,
          vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *class_pairs,
          Graph *nodes2ents)

{
  Alloc *pAVar1;
  Int IVar2;
  void *extraout_RDX;
  void *pvVar3;
  void *extraout_RDX_00;
  size_t sVar4;
  long lVar5;
  Read<signed_char> RVar6;
  Read<signed_char> *marks;
  Read<signed_char> class_dim_marks;
  vector<int,_std::allocator<int>_> dim_class_ids;
  Write<signed_char> local_c8;
  Mesh *local_b8;
  vector<Omega_h::ClassPair,_std::allocator<Omega_h::ClassPair>_> *local_b0;
  long local_a8;
  Write<signed_char> local_a0;
  string local_90;
  Write<signed_char> local_70;
  Omega_h local_60 [16];
  Graph local_50;
  
  local_b8 = mesh;
  local_b0 = class_pairs;
  IVar2 = Mesh::dim(mesh);
  local_a8 = (long)IVar2;
  if (nodes2ents[local_a8].a2ab.write_.shared_alloc_.direct_ptr != (void *)0x0) {
    pAVar1 = nodes2ents[local_a8].a2ab.write_.shared_alloc_.alloc;
    if (((ulong)pAVar1 & 1) == 0) {
      sVar4 = pAVar1->size;
    }
    else {
      sVar4 = (ulong)pAVar1 >> 3;
    }
    std::__cxx11::string::string((string *)&local_90,"",(allocator *)&local_c8);
    Read<signed_char>::Read((Read<signed_char> *)this,(int)(sVar4 >> 2) + -1,'\0',&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    pvVar3 = extraout_RDX;
    for (lVar5 = 0; lVar5 <= local_a8; lVar5 = lVar5 + 1) {
      get_dim_class_ids((vector<int,_std::allocator<int>_> *)&local_90,(Int)lVar5,local_b0);
      if (local_90._M_dataplus._M_p != (pointer)local_90._M_string_length) {
        Graph::Graph(&local_50,nodes2ents);
        mark_class_closures((Omega_h *)&local_c8,local_b8,(Int)lVar5,
                            (vector<int,_std::allocator<int>_> *)&local_90,&local_50);
        Graph::~Graph(&local_50);
        Write<signed_char>::Write(&local_a0,(Write<signed_char> *)this);
        Write<signed_char>::Write(&local_70,&local_c8);
        lor_each(local_60,(Bytes *)&local_a0,(Bytes *)&local_70);
        Write<signed_char>::operator=((Write<signed_char> *)this,(Write<signed_char> *)local_60);
        Write<signed_char>::~Write((Write<signed_char> *)local_60);
        Write<signed_char>::~Write(&local_70);
        Write<signed_char>::~Write(&local_a0);
        Write<signed_char>::~Write(&local_c8);
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_90);
      nodes2ents = nodes2ents + 1;
      pvVar3 = extraout_RDX_00;
    }
    RVar6.write_.shared_alloc_.direct_ptr = pvVar3;
    RVar6.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Read<signed_char>)RVar6.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","nodes2ents[dim].a2ab.exists()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mark.cpp"
       ,0xb1);
}

Assistant:

Read<I8> mark_class_closures(Mesh* mesh,
    std::vector<ClassPair> const& class_pairs, Graph nodes2ents[4]) {
  auto dim = mesh->dim();
  OMEGA_H_CHECK(nodes2ents[dim].a2ab.exists());
  auto nnodes = nodes2ents[dim].a2ab.size() - 1;
  auto marks = Read<I8>(nnodes, I8(0));
  for (int class_dim = 0; class_dim <= dim; ++class_dim) {
    auto dim_class_ids = get_dim_class_ids(class_dim, class_pairs);
    if (dim_class_ids.empty()) continue;
    auto class_dim_marks = mark_class_closures(
        mesh, class_dim, dim_class_ids, nodes2ents[class_dim]);
    marks = lor_each(marks, class_dim_marks);
  }
  return marks;
}